

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8 * google::protobuf::internal::WireFormat::InternalSerializeWithCachedSizesToArray
                  (Message *message,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  undefined1 uVar2;
  Descriptor *this;
  MessageOptions *target_00;
  UnknownFieldSet *target_01;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *message_reflection;
  Descriptor *descriptor;
  EpsCopyOutputStream *in_stack_00000ac0;
  uint8 *in_stack_00000ac8;
  Message *in_stack_00000ad0;
  FieldDescriptor *in_stack_00000ad8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffff18;
  Reflection *in_stack_ffffffffffffff20;
  EpsCopyOutputStream *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffff80;
  Message *in_stack_ffffffffffffff88;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  in_stack_ffffffffffffff90;
  int local_58;
  EpsCopyOutputStream *local_8;
  
  this = Message::GetDescriptor((Message *)in_stack_ffffffffffffff20);
  Message::GetReflection((Message *)in_stack_ffffffffffffff20);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x470ee6);
  target_00 = Descriptor::options(this);
  bVar1 = MessageOptions::map_entry((MessageOptions *)0x470f04);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff6c);
  if (bVar1) {
    for (local_58 = 0; in_stack_ffffffffffffff68 = Descriptor::field_count(this),
        local_58 < in_stack_ffffffffffffff68; local_58 = local_58 + 1) {
      Descriptor::field(this,local_58);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
    }
  }
  else {
    Reflection::ListFields
              ((Reflection *)in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::begin(in_stack_ffffffffffffff18);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::end(in_stack_ffffffffffffff18);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                             *)in_stack_ffffffffffffff20,
                            (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                             *)in_stack_ffffffffffffff18), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator*((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                 *)&stack0xffffffffffffff90);
    InternalSerializeField(in_stack_00000ad8,in_stack_00000ad0,in_stack_00000ac8,in_stack_00000ac0);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  *)&stack0xffffffffffffff90);
  }
  Descriptor::options(this);
  uVar2 = MessageOptions::message_set_wire_format((MessageOptions *)0x4710a4);
  if ((bool)uVar2) {
    target_01 = Reflection::GetUnknownFields
                          (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff30 =
         (EpsCopyOutputStream *)
         InternalSerializeUnknownMessageSetItemsToArray
                   ((UnknownFieldSet *)CONCAT17(uVar2,in_stack_ffffffffffffff40),(uint8 *)target_01,
                    in_stack_ffffffffffffff30);
    local_8 = in_stack_ffffffffffffff30;
  }
  else {
    Reflection::GetUnknownFields(in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
    local_8 = (EpsCopyOutputStream *)
              InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (uint8 *)target_00,
                         (EpsCopyOutputStream *)CONCAT44(uVar3,in_stack_ffffffffffffff68));
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)in_stack_ffffffffffffff30);
  return (uint8 *)local_8;
}

Assistant:

uint8* WireFormat::InternalSerializeWithCachedSizesToArray(
    const Message& message, uint8* target, io::EpsCopyOutputStream* stream) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (auto field : fields) {
    target = InternalSerializeField(field, message, target, stream);
  }

  if (descriptor->options().message_set_wire_format()) {
    return InternalSerializeUnknownMessageSetItemsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  } else {
    return InternalSerializeUnknownFieldsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  }
}